

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::mapLocalsAndEmitHeader(BinaryInstWriter *this)

{
  size_t *psVar1;
  uint uVar2;
  mapped_type mVar3;
  BufferWithRandomAccess *pBVar4;
  Index IVar5;
  bool bVar6;
  Index IVar7;
  size_t sVar8;
  ulong uVar9;
  mapped_type *pmVar10;
  uint *puVar11;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *this_00;
  reference pTVar12;
  Type *pTVar13;
  Module *pMVar14;
  reference this_01;
  iterator __first;
  iterator __last;
  mapped_type *pmVar15;
  size_type sVar16;
  mapped_type *pmVar17;
  Iterator IVar18;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar19;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar20;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar21;
  bool local_46a;
  U32LEB local_30c;
  reference local_308;
  Type *localType;
  iterator __end1_4;
  iterator __begin1_4;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *__range1_4;
  type *local_2e0;
  type *_;
  type *type_6;
  _Self local_2c8;
  iterator __end1_3;
  iterator __begin1_3;
  InsertOrderedMap<wasm::Type,_unsigned_int> *__range1_3;
  pair<unsigned_int,_unsigned_int> local_2a8;
  Type *local_2a0;
  Type *type_5;
  Iterator __end2_2;
  Iterator __begin2_2;
  Type *__range2_2;
  Index j_1;
  Index i_3;
  Type *type_4;
  iterator __end1_2;
  iterator __begin1_2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *__range1_2;
  undefined1 local_238 [4];
  Index baseIndex;
  unordered_map<wasm::Type,_unsigned_int,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
  nextFreeIndex;
  bool local_1e1;
  Type TStack_1e0;
  bool refsFirst;
  type *local_1d8;
  type *count_1;
  type *type_3;
  _Self local_1c0;
  iterator __end1_1;
  iterator __begin1_1;
  InsertOrderedMap<wasm::Type,_unsigned_int> *__range1_1;
  Type *t;
  Iterator __end2_1;
  Iterator __begin2_1;
  Type *__range2_1;
  Type type_2;
  iterator __end1;
  iterator __begin1;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *__range1;
  U32LEB local_13c;
  type *local_138;
  type *count;
  type *type_1;
  _Self local_120;
  iterator __end2;
  iterator __begin2;
  InsertOrderedMap<wasm::Type,_unsigned_int> *__range2;
  U32LEB local_fc;
  Type *local_f8;
  Type *type;
  Iterator __end3;
  Iterator __begin3;
  Type *__range3;
  Index i_2;
  size_t numBinaryLocals;
  uint local_a4;
  Type TStack_a0;
  Index j;
  ulong local_98;
  size_t size;
  Index i_1;
  Index local_7c;
  undefined1 local_78 [4];
  Index mappedIndex;
  InsertOrderedMap<wasm::Type,_unsigned_int> scratches;
  pair<unsigned_int,_unsigned_int> local_1c;
  uint local_14;
  BinaryInstWriter *pBStack_10;
  Index i;
  BinaryInstWriter *this_local;
  
  pBStack_10 = this;
  if (this->func != (Function *)0x0) {
    for (local_14 = 0; uVar9 = (ulong)local_14, sVar8 = Function::getNumParams(this->func),
        uVar9 < sVar8; local_14 = local_14 + 1) {
      uVar9 = (ulong)local_14;
      scratches.List.
      super__List_base<std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
      ._M_impl._M_node._M_size._0_4_ = 0;
      register0x00000000 =
           std::make_pair<unsigned_int&,int>
                     (&local_14,
                      (int *)&scratches.List.
                              super__List_base<std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
                              ._M_impl._M_node._M_size);
      std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_int,_true>
                (&local_1c,
                 (pair<unsigned_int,_int> *)
                 ((long)&scratches.List.
                         super__List_base<std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
                         ._M_impl._M_node._M_size + 4));
      pmVar10 = std::
                unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>
                ::operator[](&this->mappedLocals,&local_1c);
      *pmVar10 = uVar9;
    }
    countScratchLocals((InsertOrderedMap<wasm::Type,_unsigned_int> *)local_78,this);
    if ((this->DWARF & 1U) == 0) {
      this_00 = &this->func->vars;
      __end1 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin(this_00);
      type_2.id = (uintptr_t)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end(this_00);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                                         *)&type_2), bVar6) {
        pTVar12 = __gnu_cxx::
                  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                  ::operator*(&__end1);
        __range2_1 = (Type *)pTVar12->id;
        IVar18 = wasm::Type::begin((Type *)&__range2_1);
        __end2_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
             (size_t)IVar18.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent;
        PVar20 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 wasm::Type::end((Type *)&__range2_1);
        while( true ) {
          __end2_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)PVar20.index;
          t = PVar20.parent;
          bVar6 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                            ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                             &__end2_1.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *
                                    )&t);
          if (!bVar6) break;
          pTVar13 = wasm::Type::Iterator::operator*
                              ((Iterator *)
                               &__end2_1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                index);
          noteLocalType(this,(Type)pTVar13->id,1);
          ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                    ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                     &__end2_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index);
          PVar20.index = (size_t)__end2_1.
                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent;
          PVar20.parent = t;
        }
        __gnu_cxx::
        __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::
        operator++(&__end1);
      }
      __end1_1 = InsertOrderedMap<wasm::Type,_unsigned_int>::begin
                           ((InsertOrderedMap<wasm::Type,_unsigned_int> *)local_78);
      local_1c0._M_node =
           (_List_node_base *)
           InsertOrderedMap<wasm::Type,_unsigned_int>::end
                     ((InsertOrderedMap<wasm::Type,_unsigned_int> *)local_78);
      while (bVar6 = std::operator!=(&__end1_1,&local_1c0), bVar6) {
        type_3 = &std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>::operator*
                            (&__end1_1)->first;
        count_1 = (type *)std::get<0ul,wasm::Type_const,unsigned_int>
                                    ((pair<const_wasm::Type,_unsigned_int> *)type_3);
        local_1d8 = std::get<1ul,wasm::Type_const,unsigned_int>
                              ((pair<const_wasm::Type,_unsigned_int> *)type_3);
        TStack_1e0.id = *(uintptr_t *)count_1;
        noteLocalType(this,TStack_1e0,*local_1d8);
        std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>::operator++(&__end1_1);
      }
      pMVar14 = WasmBinaryWriter::getModule(this->parent);
      bVar6 = FeatureSet::hasReferenceTypes(&pMVar14->features);
      if (bVar6) {
        bVar6 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::empty(&this->localTypes);
        local_46a = false;
        if (!bVar6) {
          this_01 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[]
                              (&this->localTypes,0);
          local_46a = wasm::Type::isRef(this_01);
        }
        local_1e1 = local_46a;
        __first = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin(&this->localTypes);
        __last = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end(&this->localTypes);
        nextFreeIndex._M_h._M_single_bucket = (__node_base_ptr)&local_1e1;
        std::
        stable_sort<__gnu_cxx::__normal_iterator<wasm::Type*,std::vector<wasm::Type,std::allocator<wasm::Type>>>,wasm::BinaryInstWriter::mapLocalsAndEmitHeader()::__0>
                  ((__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                    )__first._M_current,
                   (__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                    )__last._M_current,(anon_class_8_1_f3ed76f0)nextFreeIndex._M_h._M_single_bucket)
        ;
      }
      std::
      unordered_map<wasm::Type,_unsigned_int,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
      ::unordered_map((unordered_map<wasm::Type,_unsigned_int,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
                       *)local_238);
      __range1_2._4_4_ = Function::getVarIndexBase(this->func);
      __end1_2 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin(&this->localTypes);
      type_4 = (Type *)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end(&this->localTypes);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end1_2,
                                (__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                                 *)&type_4), bVar6) {
        _j_1 = __gnu_cxx::
               __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
               ::operator*(&__end1_2);
        pmVar15 = std::
                  unordered_map<wasm::Type,_unsigned_int,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
                  ::operator[]((unordered_map<wasm::Type,_unsigned_int,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
                                *)local_238,_j_1);
        *pmVar15 = __range1_2._4_4_;
        pmVar17 = std::
                  unordered_map<wasm::Type,_unsigned_long,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_long>_>_>
                  ::operator[](&this->numLocalsByType,_j_1);
        __range1_2._4_4_ = __range1_2._4_4_ + (int)*pmVar17;
        __gnu_cxx::
        __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::
        operator++(&__end1_2);
      }
      for (__range2_2._4_4_ = Function::getVarIndexBase(this->func); uVar9 = (ulong)__range2_2._4_4_
          , sVar8 = Function::getNumLocals(this->func), uVar9 < sVar8;
          __range2_2._4_4_ = __range2_2._4_4_ + 1) {
        __range2_2._0_4_ = 0;
        __begin2_2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
             (size_t)Function::getLocalType(this->func,__range2_2._4_4_);
        psVar1 = &__begin2_2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                  index;
        IVar18 = wasm::Type::begin((Type *)psVar1);
        __begin2_2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)IVar18.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     index;
        __end2_2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
             (size_t)IVar18.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent;
        PVar21 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 wasm::Type::end((Type *)psVar1);
        while( true ) {
          __end2_2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)PVar21.index;
          type_5 = PVar21.parent;
          bVar6 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                            ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                             &__end2_2.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *
                                    )&type_5);
          if (!bVar6) break;
          local_2a0 = wasm::Type::Iterator::operator*
                                ((Iterator *)
                                 &__end2_2.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                  .index);
          pmVar15 = std::
                    unordered_map<wasm::Type,_unsigned_int,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
                    ::operator[]((unordered_map<wasm::Type,_unsigned_int,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
                                  *)local_238,local_2a0);
          uVar2 = *pmVar15;
          *pmVar15 = uVar2 + 1;
          __range1_3._4_4_ = (int)__range2_2;
          __range2_2._0_4_ = (int)__range2_2 + 1;
          std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int,_true>
                    (&local_2a8,(uint *)((long)&__range2_2 + 4),(uint *)((long)&__range1_3 + 4));
          pmVar10 = std::
                    unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>
                    ::operator[](&this->mappedLocals,&local_2a8);
          *pmVar10 = (ulong)uVar2;
          ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                    ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                     &__end2_2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index);
          PVar21.index = (size_t)__end2_2.
                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent;
          PVar21.parent = type_5;
        }
      }
      __end1_3 = InsertOrderedMap<wasm::Type,_unsigned_int>::begin
                           ((InsertOrderedMap<wasm::Type,_unsigned_int> *)local_78);
      local_2c8._M_node =
           (_List_node_base *)
           InsertOrderedMap<wasm::Type,_unsigned_int>::end
                     ((InsertOrderedMap<wasm::Type,_unsigned_int> *)local_78);
      while (bVar6 = std::operator!=(&__end1_3,&local_2c8), bVar6) {
        type_6 = &std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>::operator*
                            (&__end1_3)->first;
        _ = (type *)std::get<0ul,wasm::Type_const,unsigned_int>
                              ((pair<const_wasm::Type,_unsigned_int> *)type_6);
        local_2e0 = std::get<1ul,wasm::Type_const,unsigned_int>
                              ((pair<const_wasm::Type,_unsigned_int> *)type_6);
        pmVar15 = std::
                  unordered_map<wasm::Type,_unsigned_int,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
                  ::operator[]((unordered_map<wasm::Type,_unsigned_int,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
                                *)local_238,(key_type *)_);
        mVar3 = *pmVar15;
        puVar11 = InsertOrderedMap<wasm::Type,_unsigned_int>::operator[]
                            (&this->scratchLocals,(Type *)_);
        *puVar11 = mVar3;
        std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>::operator++(&__end1_3);
      }
      pBVar4 = this->o;
      sVar16 = std::
               unordered_map<wasm::Type,_unsigned_long,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_long>_>_>
               ::size(&this->numLocalsByType);
      LEB<unsigned_int,_unsigned_char>::LEB
                ((LEB<unsigned_int,_unsigned_char> *)((long)&__range1_4 + 4),(uint)sVar16);
      BufferWithRandomAccess::operator<<(pBVar4,__range1_4._4_4_);
      __end1_4 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin(&this->localTypes);
      localType = (Type *)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end
                                    (&this->localTypes);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end1_4,
                                (__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                                 *)&localType), bVar6) {
        local_308 = __gnu_cxx::
                    __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                    ::operator*(&__end1_4);
        pBVar4 = this->o;
        pmVar17 = std::
                  unordered_map<wasm::Type,_unsigned_long,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_long>_>_>
                  ::at(&this->numLocalsByType,local_308);
        LEB<unsigned_int,_unsigned_char>::LEB(&local_30c,(uint)*pmVar17);
        BufferWithRandomAccess::operator<<(pBVar4,local_30c);
        WasmBinaryWriter::writeType(this->parent,(Type)local_308->id);
        __gnu_cxx::
        __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::
        operator++(&__end1_4);
      }
      std::
      unordered_map<wasm::Type,_unsigned_int,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
      ::~unordered_map((unordered_map<wasm::Type,_unsigned_int,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
                        *)local_238);
    }
    else {
      local_7c = Function::getVarIndexBase(this->func);
      for (size._0_4_ = Function::getVarIndexBase(this->func); uVar9 = (ulong)(Index)size,
          sVar8 = Function::getNumLocals(this->func), IVar5 = local_7c, uVar9 < sVar8;
          size._0_4_ = (Index)size + 1) {
        TStack_a0 = Function::getLocalType(this->func,(Index)size);
        local_98 = wasm::Type::size(&stack0xffffffffffffff60);
        for (local_a4 = 0; local_a4 < local_98; local_a4 = local_a4 + 1) {
          uVar9 = (ulong)local_7c;
          local_7c = local_7c + 1;
          register0x00000000 = std::make_pair<unsigned_int&,unsigned_int&>((uint *)&size,&local_a4);
          pmVar10 = std::
                    unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>
                    ::operator[](&this->mappedLocals,(key_type *)((long)&numBinaryLocals + 4));
          *pmVar10 = uVar9;
        }
      }
      IVar7 = Function::getVarIndexBase(this->func);
      sVar8 = InsertOrderedMap<wasm::Type,_unsigned_int>::size
                        ((InsertOrderedMap<wasm::Type,_unsigned_int> *)local_78);
      _i_2 = (IVar5 - IVar7) + sVar8;
      pBVar4 = this->o;
      LEB<unsigned_int,_unsigned_char>::LEB
                ((LEB<unsigned_int,_unsigned_char> *)((long)&__range3 + 4),i_2);
      BufferWithRandomAccess::operator<<(pBVar4,__range3._4_4_);
      for (__range3._0_4_ = Function::getVarIndexBase(this->func); uVar9 = (ulong)(Index)__range3,
          sVar8 = Function::getNumLocals(this->func), uVar9 < sVar8;
          __range3._0_4_ = (Index)__range3 + 1) {
        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
             (size_t)Function::getLocalType(this->func,(Index)__range3);
        psVar1 = &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
        ;
        IVar18 = wasm::Type::begin((Type *)psVar1);
        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)IVar18.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     index;
        __end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
             (size_t)IVar18.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent;
        PVar19 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 wasm::Type::end((Type *)psVar1);
        while( true ) {
          __end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)PVar19.index;
          type = PVar19.parent;
          bVar6 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                            ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                             &__end3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *
                                    )&type);
          if (!bVar6) break;
          local_f8 = wasm::Type::Iterator::operator*
                               ((Iterator *)
                                &__end3.
                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .index);
          pBVar4 = this->o;
          LEB<unsigned_int,_unsigned_char>::LEB(&local_fc,1);
          BufferWithRandomAccess::operator<<(pBVar4,local_fc);
          WasmBinaryWriter::writeType(this->parent,(Type)local_f8->id);
          ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                    ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                     &__end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index);
          PVar19.index = (size_t)__end3.
                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent;
          PVar19.parent = type;
        }
      }
      __end2 = InsertOrderedMap<wasm::Type,_unsigned_int>::begin
                         ((InsertOrderedMap<wasm::Type,_unsigned_int> *)local_78);
      local_120._M_node =
           (_List_node_base *)
           InsertOrderedMap<wasm::Type,_unsigned_int>::end
                     ((InsertOrderedMap<wasm::Type,_unsigned_int> *)local_78);
      while (bVar6 = std::operator!=(&__end2,&local_120), bVar6) {
        type_1 = &std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>::operator*
                            (&__end2)->first;
        count = (type *)std::get<0ul,wasm::Type_const,unsigned_int>
                                  ((pair<const_wasm::Type,_unsigned_int> *)type_1);
        local_138 = std::get<1ul,wasm::Type_const,unsigned_int>
                              ((pair<const_wasm::Type,_unsigned_int> *)type_1);
        pBVar4 = this->o;
        LEB<unsigned_int,_unsigned_char>::LEB(&local_13c,*local_138);
        BufferWithRandomAccess::operator<<(pBVar4,local_13c);
        WasmBinaryWriter::writeType(this->parent,(Type)*(uintptr_t *)count);
        IVar5 = local_7c;
        puVar11 = InsertOrderedMap<wasm::Type,_unsigned_int>::operator[]
                            (&this->scratchLocals,(Type *)count);
        *puVar11 = IVar5;
        local_7c = *local_138 + local_7c;
        std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>::operator++(&__end2);
      }
    }
    InsertOrderedMap<wasm::Type,_unsigned_int>::~InsertOrderedMap
              ((InsertOrderedMap<wasm::Type,_unsigned_int> *)local_78);
    return;
  }
  __assert_fail("func && \"BinaryInstWriter: function is not set\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                ,0xabf,"void wasm::BinaryInstWriter::mapLocalsAndEmitHeader()");
}

Assistant:

void BinaryInstWriter::mapLocalsAndEmitHeader() {
  assert(func && "BinaryInstWriter: function is not set");
  // Map params
  for (Index i = 0; i < func->getNumParams(); i++) {
    mappedLocals[std::make_pair(i, 0)] = i;
  }

  auto scratches = countScratchLocals();

  // Normally we map all locals of the same type into a range of adjacent
  // addresses, which is more compact. However, if we need to keep DWARF valid,
  // do not do any reordering at all - instead, do a trivial mapping that
  // keeps everything unmoved.
  //
  // Unless we have run DWARF-invalidating passes, all locals added during the
  // process that are not in DWARF info (tuple locals, tuple scratch locals,
  // locals to resolve stacky format, ..) have been all tacked on to the
  // existing locals and happen at the end, so as long as we print the local
  // types in order, we don't invalidate original local DWARF info here.
  if (DWARF) {
    Index mappedIndex = func->getVarIndexBase();
    for (Index i = func->getVarIndexBase(); i < func->getNumLocals(); i++) {
      size_t size = func->getLocalType(i).size();
      for (Index j = 0; j < size; j++) {
        mappedLocals[std::make_pair(i, j)] = mappedIndex++;
      }
    }

    size_t numBinaryLocals =
      mappedIndex - func->getVarIndexBase() + scratches.size();

    o << U32LEB(numBinaryLocals);

    for (Index i = func->getVarIndexBase(); i < func->getNumLocals(); i++) {
      for (const auto& type : func->getLocalType(i)) {
        o << U32LEB(1);
        parent.writeType(type);
      }
    }
    for (auto& [type, count] : scratches) {
      o << U32LEB(count);
      parent.writeType(type);
      scratchLocals[type] = mappedIndex;
      mappedIndex += count;
    }
    return;
  }

  for (auto type : func->vars) {
    for (const auto& t : type) {
      noteLocalType(t);
    }
  }

  for (auto& [type, count] : scratches) {
    noteLocalType(type, count);
  }

  if (parent.getModule()->features.hasReferenceTypes()) {
    // Sort local types in a way that keeps all MVP types together and all
    // reference types together. E.g. it is helpful to avoid a block of i32s in
    // between blocks of different reference types, since clearing out reference
    // types may require different work.
    //
    // See https://github.com/WebAssembly/binaryen/issues/4773
    //
    // In order to decide whether to put MVP types or reference types first,
    // look at the type of the first local. In an optimized binary we will have
    // sorted the locals by frequency of uses, so this way we'll keep the most
    // commonly-used local at the top, which should work well in many cases.
    bool refsFirst = !localTypes.empty() && localTypes[0].isRef();
    std::stable_sort(localTypes.begin(), localTypes.end(), [&](Type a, Type b) {
      if (refsFirst) {
        return a.isRef() && !b.isRef();
      } else {
        return !a.isRef() && b.isRef();
      }
    });
  }

  // Map IR (local index, tuple index) pairs to binary local indices. Since
  // locals are grouped by type, start by calculating the base indices for each
  // type.
  std::unordered_map<Type, Index> nextFreeIndex;
  Index baseIndex = func->getVarIndexBase();
  for (auto& type : localTypes) {
    nextFreeIndex[type] = baseIndex;
    baseIndex += numLocalsByType[type];
  }

  // Map the IR index pairs to indices.
  for (Index i = func->getVarIndexBase(); i < func->getNumLocals(); i++) {
    Index j = 0;
    for (const auto& type : func->getLocalType(i)) {
      mappedLocals[{i, j++}] = nextFreeIndex[type]++;
    }
  }

  // Map scratch locals to the remaining indices.
  for (auto& [type, _] : scratches) {
    scratchLocals[type] = nextFreeIndex[type];
  }

  o << U32LEB(numLocalsByType.size());
  for (auto& localType : localTypes) {
    o << U32LEB(numLocalsByType.at(localType));
    parent.writeType(localType);
  }
}